

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getRSAPrivateKey(SoftHSM *this,RSAPrivateKey *privateKey,Token *token,OSObject *key)

{
  Token *pTVar1;
  int iVar2;
  undefined1 in_CL;
  undefined1 uVar3;
  byte bVar4;
  undefined7 in_register_00000009;
  Token *in_RDX;
  long *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  bool bOK;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  ByteString prime1;
  ByteString privateExponent;
  ByteString publicExponent;
  ByteString modulus;
  bool isKeyPrivate;
  ByteString *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  byte local_4ba;
  byte local_4aa;
  byte local_49a;
  byte local_48a;
  byte local_47a;
  byte local_46a;
  byte local_45a;
  undefined1 local_448 [40];
  undefined1 local_420 [40];
  undefined1 local_3f8 [40];
  undefined1 local_3d0 [40];
  undefined1 local_3a8 [40];
  undefined1 local_380 [40];
  undefined1 local_358 [40];
  undefined1 local_330 [40];
  undefined4 local_308;
  byte local_301;
  EVP_PKEY_CTX local_300 [47];
  byte local_2d1;
  EVP_PKEY_CTX local_2d0 [47];
  byte local_2a1;
  EVP_PKEY_CTX local_2a0 [47];
  byte local_271;
  EVP_PKEY_CTX local_270 [47];
  byte local_241;
  EVP_PKEY_CTX local_240 [47];
  byte local_211;
  EVP_PKEY_CTX local_210 [47];
  byte local_1e1;
  EVP_PKEY_CTX local_1e0 [47];
  byte local_1b1;
  EVP_PKEY_CTX local_1b0 [47];
  byte local_181;
  uchar local_180 [40];
  uchar local_158 [40];
  uchar local_130 [40];
  uchar local_108 [40];
  uchar local_e0 [40];
  uchar local_b8 [56];
  uchar local_80 [40];
  uchar local_58 [47];
  byte local_29;
  long *local_28;
  Token *local_20;
  long *local_18;
  CK_RV local_8;
  
  local_28 = (long *)CONCAT71(in_register_00000009,in_CL);
  if (in_RSI == (long *)0x0) {
    return 7;
  }
  if (in_RDX == (Token *)0x0) {
    return 7;
  }
  if (local_28 == (long *)0x0) {
    return 7;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_29 = (**(code **)(*local_28 + 0x20))(local_28,2,0);
  ByteString::ByteString((ByteString *)0x16a707);
  ByteString::ByteString((ByteString *)0x16a714);
  ByteString::ByteString((ByteString *)0x16a723);
  ByteString::ByteString((ByteString *)0x16a732);
  ByteString::ByteString((ByteString *)0x16a741);
  ByteString::ByteString((ByteString *)0x16a750);
  ByteString::ByteString((ByteString *)0x16a75f);
  ByteString::ByteString((ByteString *)0x16a76e);
  pTVar1 = local_20;
  if ((local_29 & 1) == 0) {
    (**(code **)(*local_28 + 0x30))(local_330,local_28,0x120);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16af58);
    (**(code **)(*local_28 + 0x30))(local_358,local_28,0x122);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16af9c);
    (**(code **)(*local_28 + 0x30))(local_380,local_28,0x123);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16afe0);
    (**(code **)(*local_28 + 0x30))(local_3a8,local_28,0x124);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16b024);
    (**(code **)(*local_28 + 0x30))(local_3d0,local_28,0x125);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16b068);
    (**(code **)(*local_28 + 0x30))(local_3f8,local_28,0x126);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16b0ac);
    (**(code **)(*local_28 + 0x30))(local_420,local_28,0x127);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16b0f0);
    (**(code **)(*local_28 + 0x30))(local_448,local_28,0x128);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28);
    ByteString::~ByteString((ByteString *)0x16b134);
  }
  else {
    local_181 = 1;
    uVar3 = 1;
    local_1b1 = 0;
    (**(code **)(*local_28 + 0x30))(local_1b0,local_28,0x120);
    local_1b1 = 1;
    iVar2 = Token::decrypt(pTVar1,local_1b0,local_58,(size_t *)CONCAT71(in_register_00000009,uVar3),
                           in_R8,in_R9);
    local_181 = (byte)iVar2 & 1;
    if ((local_1b1 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16a834);
    }
    pTVar1 = local_20;
    local_1e1 = 0;
    local_45a = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_1e0,local_28,0x122);
      local_1e1 = 1;
      iVar2 = Token::decrypt(pTVar1,local_1e0,local_80,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_45a = (byte)iVar2;
    }
    local_181 = local_45a & 1;
    if ((local_1e1 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16a8d3);
    }
    pTVar1 = local_20;
    local_211 = 0;
    local_46a = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_210,local_28,0x123);
      local_211 = 1;
      iVar2 = Token::decrypt(pTVar1,local_210,local_b8,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_46a = (byte)iVar2;
    }
    local_181 = local_46a & 1;
    if ((local_211 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16a972);
    }
    pTVar1 = local_20;
    local_241 = 0;
    local_47a = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_240,local_28,0x124);
      local_241 = 1;
      iVar2 = Token::decrypt(pTVar1,local_240,local_e0,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_47a = (byte)iVar2;
    }
    local_181 = local_47a & 1;
    if ((local_241 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16aa11);
    }
    pTVar1 = local_20;
    local_271 = 0;
    local_48a = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_270,local_28,0x125);
      local_271 = 1;
      iVar2 = Token::decrypt(pTVar1,local_270,local_108,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_48a = (byte)iVar2;
    }
    local_181 = local_48a & 1;
    if ((local_271 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16aab0);
    }
    pTVar1 = local_20;
    local_2a1 = 0;
    local_49a = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_2a0,local_28,0x126);
      local_2a1 = 1;
      iVar2 = Token::decrypt(pTVar1,local_2a0,local_130,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_49a = (byte)iVar2;
    }
    local_181 = local_49a & 1;
    if ((local_2a1 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16ab4f);
    }
    pTVar1 = local_20;
    local_2d1 = 0;
    local_4aa = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_2d0,local_28,0x127);
      local_2d1 = 1;
      iVar2 = Token::decrypt(pTVar1,local_2d0,local_158,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_4aa = (byte)iVar2;
    }
    local_181 = local_4aa & 1;
    if ((local_2d1 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16abee);
    }
    local_301 = 0;
    local_4ba = 0;
    if ((local_181 & 1) != 0) {
      bVar4 = local_181;
      (**(code **)(*local_28 + 0x30))(local_300,local_28,0x128);
      local_301 = 1;
      iVar2 = Token::decrypt(local_20,local_300,local_180,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_4ba = (byte)iVar2;
    }
    local_181 = local_4ba & 1;
    if ((local_301 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x16ac8d);
    }
    if ((local_181 & 1) == 0) {
      local_8 = 5;
      goto LAB_0016b358;
    }
  }
  (**(code **)(*local_18 + 0x70))(local_18,local_58);
  (**(code **)(*local_18 + 0x78))(local_18,local_80);
  (**(code **)(*local_18 + 0x68))(local_18,local_b8);
  (**(code **)(*local_18 + 0x40))(local_18,local_e0);
  (**(code **)(*local_18 + 0x48))(local_18,local_108);
  (**(code **)(*local_18 + 0x58))(local_18,local_130);
  (**(code **)(*local_18 + 0x60))(local_18,local_158);
  (**(code **)(*local_18 + 0x50))(local_18,local_180);
  local_8 = 0;
LAB_0016b358:
  local_308 = 1;
  ByteString::~ByteString((ByteString *)0x16b365);
  ByteString::~ByteString((ByteString *)0x16b372);
  ByteString::~ByteString((ByteString *)0x16b37f);
  ByteString::~ByteString((ByteString *)0x16b38c);
  ByteString::~ByteString((ByteString *)0x16b399);
  ByteString::~ByteString((ByteString *)0x16b3a6);
  ByteString::~ByteString((ByteString *)0x16b3b3);
  ByteString::~ByteString((ByteString *)0x16b3c0);
  return local_8;
}

Assistant:

CK_RV SoftHSM::getRSAPrivateKey(RSAPrivateKey* privateKey, Token* token, OSObject* key)
{
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// RSA Private Key Attributes
	ByteString modulus;
	ByteString publicExponent;
	ByteString privateExponent;
	ByteString prime1;
	ByteString prime2;
	ByteString exponent1;
	ByteString exponent2;
	ByteString coefficient;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_MODULUS), modulus);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PUBLIC_EXPONENT), publicExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIVATE_EXPONENT), privateExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_1), prime1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_2), prime2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_1), exponent1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_2), exponent2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_COEFFICIENT), coefficient);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		modulus = key->getByteStringValue(CKA_MODULUS);
		publicExponent = key->getByteStringValue(CKA_PUBLIC_EXPONENT);
		privateExponent = key->getByteStringValue(CKA_PRIVATE_EXPONENT);
		prime1 = key->getByteStringValue(CKA_PRIME_1);
		prime2 = key->getByteStringValue(CKA_PRIME_2);
		exponent1 =  key->getByteStringValue(CKA_EXPONENT_1);
		exponent2 = key->getByteStringValue(CKA_EXPONENT_2);
		coefficient = key->getByteStringValue(CKA_COEFFICIENT);
	}

	privateKey->setN(modulus);
	privateKey->setE(publicExponent);
	privateKey->setD(privateExponent);
	privateKey->setP(prime1);
	privateKey->setQ(prime2);
	privateKey->setDP1(exponent1);
	privateKey->setDQ1(exponent2);
	privateKey->setPQ(coefficient);

	return CKR_OK;
}